

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

int nn_ws_match_value(char *termseq,char **subj,int ignore_leading_sp,int ignore_trailing_sp,
                     char **addr,size_t *len)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__haystack;
  
  if ((termseq == (char *)0x0) || (__haystack = *subj, __haystack == (char *)0x0)) {
    nn_ws_match_value_cold_1();
  }
  if (addr != (char **)0x0) {
    *addr = (char *)0x0;
  }
  if (len != (size_t *)0x0) {
    *len = 0;
  }
  pcVar3 = strstr(__haystack,termseq);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    sVar4 = strlen(termseq);
    *subj = pcVar3 + sVar4;
    pcVar1 = __haystack;
    if (ignore_leading_sp != 0) {
      do {
        __haystack = pcVar1;
        if (pcVar3 <= __haystack) break;
        pcVar1 = __haystack + 1;
      } while (*__haystack == ' ');
    }
    if (addr != (char **)0x0) {
      *addr = __haystack;
    }
    iVar2 = 1;
    if (__haystack != pcVar3) {
      pcVar1 = pcVar3;
      if (ignore_trailing_sp != 0) {
        do {
          pcVar3 = pcVar1;
          if (pcVar3 <= __haystack) break;
          pcVar1 = pcVar3 + -1;
        } while (pcVar3[-1] == ' ');
      }
      if (len != (size_t *)0x0) {
        *len = (long)pcVar3 - (long)__haystack;
      }
    }
  }
  return iVar2;
}

Assistant:

static int nn_ws_match_value (const char* termseq, const char **subj,
    int ignore_leading_sp, int ignore_trailing_sp, const char **addr,
    size_t* const len)
{
    const char *start;
    const char *end;

    nn_assert (termseq && *subj);

    start = *subj;
    if (addr)
        *addr = NULL;
    if (len)
        *len = 0;

    /*  Find first occurence of termination sequence. */
    end = strstr (start, termseq);

    /*  Was a termination sequence found? */
    if (end) {
        *subj = end + strlen (termseq);
    }
    else {
        return NN_WS_HANDSHAKE_NOMATCH;
    }
        
    if (ignore_leading_sp) {
        while (*start == '\x20' && start < end) {
            start++;
        }
    }

    if (addr)
        *addr = start;

    /*  In this special case, the value was "found", but is just empty or
        ignored space. */
    if (start == end)
        return NN_WS_HANDSHAKE_MATCH;

    if (ignore_trailing_sp) {
        while (*(end - 1) == '\x20' && start < end) {
            end--;
        }
    }

    if (len)
        *len = end - start;

    return NN_WS_HANDSHAKE_MATCH;
}